

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

StringLocalizationInfo * __thiscall icu_63::LocDataParser::doParse(LocDataParser *this)

{
  UChar *pUVar1;
  bool bVar2;
  void **ppvVar3;
  int32_t iVar4;
  UBool UVar5;
  UChar **elem;
  StringLocalizationInfo *pSVar6;
  char *size;
  int32_t requiredLength;
  VArray array;
  
  skipWhitespace(this);
  size = (char *)0x3c;
  UVar5 = checkInc(this,L'<');
  if (UVar5 == '\0') goto LAB_00216954;
  array.buf = (void **)0x0;
  array.cap = 0;
  array.size = 0;
  array.deleter = DeleteFn;
  requiredLength = -1;
  while( true ) {
    elem = nextArray(this,&requiredLength);
    skipWhitespace(this);
    size = (char *)0x2c;
    UVar5 = check(this,L',');
    if (elem == (UChar **)0x0) break;
    VArray::add(&array,elem,this->ec);
    if (UVar5 == '\0') goto LAB_002168e5;
    this->p = this->p + 1;
    this->ch = L'\xffff';
  }
  if (UVar5 == '\0') {
LAB_002168e5:
    skipWhitespace(this);
    size = (char *)0x3e;
    UVar5 = checkInc(this,L'>');
    if (UVar5 == '\0') {
      size = (char *)0x3c;
      check(this,L'<');
LAB_00216937:
      parseError(this,size);
      goto LAB_0021693f;
    }
    skipWhitespace(this);
    if (this->p != this->e) goto LAB_00216937;
    size = (char *)0x0;
    VArray::add(&array,(void *)0x0,this->ec);
    ppvVar3 = array.buf;
    if (U_ZERO_ERROR < *this->ec) {
      bVar2 = true;
      goto LAB_00216942;
    }
    iVar4 = array.size;
    array.buf = (void **)0x0;
    array.cap = 0;
    array.size = 0;
    pSVar6 = (StringLocalizationInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    if (pSVar6 == (StringLocalizationInfo *)0x0) goto LAB_0021693f;
    pUVar1 = this->data;
    (pSVar6->super_LocalizationInfo).refcount = 0;
    (pSVar6->super_LocalizationInfo)._vptr_LocalizationInfo =
         (_func_int **)&PTR__StringLocalizationInfo_0039a4d0;
    pSVar6->info = pUVar1;
    pSVar6->data = (UChar ***)ppvVar3;
    pSVar6->numRuleSets = requiredLength + -2;
    pSVar6->numLocales = iVar4 + -2;
    bVar2 = false;
  }
  else {
    parseError(this,size);
LAB_0021693f:
    bVar2 = false;
LAB_00216942:
    pSVar6 = (StringLocalizationInfo *)0x0;
  }
  VArray::~VArray(&array);
  if (!bVar2) {
    return pSVar6;
  }
LAB_00216954:
  parseError(this,size);
  return (StringLocalizationInfo *)0x0;
}

Assistant:

StringLocalizationInfo*
LocDataParser::doParse(void) {
    skipWhitespace();
    if (!checkInc(OPEN_ANGLE)) {
        ERROR("Missing open angle");
    } else {
        VArray array(DeleteFn);
        UBool mightHaveNext = TRUE;
        int32_t requiredLength = -1;
        while (mightHaveNext) {
            mightHaveNext = FALSE;
            UChar** elem = nextArray(requiredLength);
            skipWhitespace();
            UBool haveComma = check(COMMA);
            if (elem) {
                array.add(elem, ec);
                if (haveComma) {
                    inc();
                    mightHaveNext = TRUE;
                }
            } else if (haveComma) {
                ERROR("Unexpected character");
            }
        }

        skipWhitespace();
        if (!checkInc(CLOSE_ANGLE)) {
            if (check(OPEN_ANGLE)) {
                ERROR("Missing comma in outer array");
            } else {
                ERROR("Missing close angle bracket in outer array");
            }
        }

        skipWhitespace();
        if (p != e) {
            ERROR("Extra text after close of localization data");
        }

        array.add(NULL, ec);
        if (U_SUCCESS(ec)) {
            int32_t numLocs = array.length() - 2; // subtract first, NULL
            UChar*** result = (UChar***)array.release();
            
            return new StringLocalizationInfo(data, result, requiredLength-2, numLocs); // subtract first, NULL
        }
    }
  
    ERROR("Unknown error");
}